

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_half(secp256k1_scalar *r,secp256k1_scalar *a)

{
  ulong a_00;
  uint64_t uVar1;
  ulong *in_RSI;
  uint64_t *in_RDI;
  secp256k1_uint128 t;
  uint64_t mask;
  uint in_stack_ffffffffffffffdc;
  secp256k1_uint128 *in_stack_ffffffffffffffe0;
  
  a_00 = -(*in_RSI & 1);
  secp256k1_scalar_verify((secp256k1_scalar *)0x12a42e);
  secp256k1_u128_from_u64
            ((secp256k1_uint128 *)&stack0xffffffffffffffd8,*in_RSI >> 1 | in_RSI[1] << 0x3f);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8,a_00 & 0xdfe92f46681b20a1);
  uVar1 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8);
  *in_RDI = uVar1;
  secp256k1_u128_rshift(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  secp256k1_u128_accum_u64
            ((secp256k1_uint128 *)&stack0xffffffffffffffd8,in_RSI[1] >> 1 | in_RSI[2] << 0x3f);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8,a_00 & 0x5d576e7357a4501d);
  uVar1 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8);
  in_RDI[1] = uVar1;
  secp256k1_u128_rshift(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  secp256k1_u128_accum_u64
            ((secp256k1_uint128 *)&stack0xffffffffffffffd8,in_RSI[2] >> 1 | in_RSI[3] << 0x3f);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8,a_00);
  uVar1 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8);
  in_RDI[2] = uVar1;
  secp256k1_u128_rshift(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  uVar1 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8);
  in_RDI[3] = uVar1 + (in_RSI[3] >> 1) + (a_00 & 0x7fffffffffffffff);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8,in_RSI[3] >> 1);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8,a_00 & 0x7fffffffffffffff);
  secp256k1_u128_rshift(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  uVar1 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffd8);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/scalar_4x64_impl.h"
            ,0xe5,"test condition failed: secp256k1_u128_to_u64(&t) == 0");
    abort();
  }
  secp256k1_scalar_verify((secp256k1_scalar *)0x12a603);
  return;
}

Assistant:

static void secp256k1_scalar_half(secp256k1_scalar *r, const secp256k1_scalar *a) {
    /* Writing `/` for field division and `//` for integer division, we compute
     *
     *   a/2 = (a - (a&1))/2 + (a&1)/2
     *       = (a >> 1) + (a&1 ?    1/2 : 0)
     *       = (a >> 1) + (a&1 ? n//2+1 : 0),
     *
     * where n is the group order and in the last equality we have used 1/2 = n//2+1 (mod n).
     * For n//2, we have the constants SECP256K1_N_H_0, ...
     *
     * This sum does not overflow. The most extreme case is a = -2, the largest odd scalar. Here:
     * - the left summand is:  a >> 1 = (a - a&1)/2 = (n-2-1)//2           = (n-3)//2
     * - the right summand is: a&1 ? n//2+1 : 0 = n//2+1 = (n-1)//2 + 2//2 = (n+1)//2
     * Together they sum to (n-3)//2 + (n+1)//2 = (2n-2)//2 = n - 1, which is less than n.
     */
    uint64_t mask = -(uint64_t)(a->d[0] & 1U);
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(a);

    secp256k1_u128_from_u64(&t, (a->d[0] >> 1) | (a->d[1] << 63));
    secp256k1_u128_accum_u64(&t, (SECP256K1_N_H_0 + 1U) & mask);
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, (a->d[1] >> 1) | (a->d[2] << 63));
    secp256k1_u128_accum_u64(&t, SECP256K1_N_H_1 & mask);
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, (a->d[2] >> 1) | (a->d[3] << 63));
    secp256k1_u128_accum_u64(&t, SECP256K1_N_H_2 & mask);
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    r->d[3] = secp256k1_u128_to_u64(&t) + (a->d[3] >> 1) + (SECP256K1_N_H_3 & mask);
#ifdef VERIFY
    /* The line above only computed the bottom 64 bits of r->d[3]; redo the computation
     * in full 128 bits to make sure the top 64 bits are indeed zero. */
    secp256k1_u128_accum_u64(&t, a->d[3] >> 1);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_H_3 & mask);
    secp256k1_u128_rshift(&t, 64);
    VERIFY_CHECK(secp256k1_u128_to_u64(&t) == 0);

    SECP256K1_SCALAR_VERIFY(r);
#endif
}